

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O2

void XPMP2::XPMPSendNotification(Aircraft *plane,XPMPPlaneNotification _notification)

{
  iterator __end1;
  undefined8 *puVar1;
  
  puVar1 = &DAT_002cc4d0;
  while (puVar1 = (undefined8 *)*puVar1, puVar1 != &DAT_002cc4d0) {
    (*(code *)puVar1[2])(plane->modeS_id,_notification,puVar1[3]);
  }
  return;
}

Assistant:

void XPMPSendNotification (const Aircraft& plane, XPMPPlaneNotification _notification)
{
    for (const XPMPPlaneNotifierTy& n: glob.listObservers)
        n.func(plane.GetModeS_ID(),
               _notification,
               n.refcon);
}